

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O1

Token * __thiscall
toml::internal::Lexer::nextToken(Token *__return_storage_ptr__,Lexer *this,bool isValueToken)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = std::istream::peek();
  do {
    if (uVar1 == 0xffffffff) {
      __return_storage_ptr__->type_ = END_OF_FILE;
LAB_00134301:
      (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->str_value_).field_2;
      (__return_storage_ptr__->str_value_)._M_string_length = 0;
      (__return_storage_ptr__->str_value_).field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->time_value_).__d.__r = 0;
      return __return_storage_ptr__;
    }
    uVar1 = uVar1 & 0xff;
    if (uVar1 < 0x20) {
      if ((uVar1 != 9) && (uVar1 != 0xd)) {
        if (uVar1 != 10) goto switchD_00134279_caseD_21;
        iVar2 = std::istream::get();
        if (iVar2 == 10) {
          this->lineNo_ = this->lineNo_ + 1;
        }
        __return_storage_ptr__->type_ = END_OF_LINE;
        goto LAB_00134301;
      }
switchD_00134279_caseD_20:
      iVar2 = std::istream::get();
      if (iVar2 == 10) {
        this->lineNo_ = this->lineNo_ + 1;
      }
    }
    else {
      if (0x3c < uVar1) {
        if (uVar1 < 0x5d) {
          if (uVar1 == 0x3d) {
            iVar2 = std::istream::get();
            if (iVar2 == 10) {
              this->lineNo_ = this->lineNo_ + 1;
            }
            __return_storage_ptr__->type_ = EQUAL;
            goto LAB_00134301;
          }
          if (uVar1 == 0x5b) {
            iVar2 = std::istream::get();
            if (iVar2 == 10) {
              this->lineNo_ = this->lineNo_ + 1;
            }
            __return_storage_ptr__->type_ = LBRACKET;
            goto LAB_00134301;
          }
        }
        else {
          if (uVar1 == 0x5d) {
            iVar2 = std::istream::get();
            if (iVar2 == 10) {
              this->lineNo_ = this->lineNo_ + 1;
            }
            __return_storage_ptr__->type_ = RBRACKET;
            goto LAB_00134301;
          }
          if (uVar1 == 0x7b) {
            iVar2 = std::istream::get();
            if (iVar2 == 10) {
              this->lineNo_ = this->lineNo_ + 1;
            }
            __return_storage_ptr__->type_ = LBRACE;
            goto LAB_00134301;
          }
          if (uVar1 == 0x7d) {
            iVar2 = std::istream::get();
            if (iVar2 == 10) {
              this->lineNo_ = this->lineNo_ + 1;
            }
            __return_storage_ptr__->type_ = RBRACE;
            goto LAB_00134301;
          }
        }
switchD_00134279_caseD_21:
        if (isValueToken) {
          nextValue(__return_storage_ptr__,this);
          return __return_storage_ptr__;
        }
        nextKey(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      switch(uVar1) {
      case 0x20:
        goto switchD_00134279_caseD_20;
      default:
        goto switchD_00134279_caseD_21;
      case 0x22:
        nextStringDoubleQuote(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      case 0x23:
        iVar2 = std::istream::peek();
        if ((char)iVar2 != '\n' && iVar2 != -1) {
          do {
            iVar2 = std::istream::get();
            if (iVar2 == 10) {
              this->lineNo_ = this->lineNo_ + 1;
            }
            iVar2 = std::istream::peek();
          } while ((iVar2 != -1) && ((char)iVar2 != '\n'));
        }
        break;
      case 0x27:
        nextStringSingleQuote(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      case 0x2c:
        iVar2 = std::istream::get();
        if (iVar2 == 10) {
          this->lineNo_ = this->lineNo_ + 1;
        }
        __return_storage_ptr__->type_ = COMMA;
        goto LAB_00134301;
      case 0x2e:
        iVar2 = std::istream::get();
        if (iVar2 == 10) {
          this->lineNo_ = this->lineNo_ + 1;
        }
        __return_storage_ptr__->type_ = DOT;
        goto LAB_00134301;
      }
    }
    uVar1 = std::istream::peek();
  } while( true );
}

Assistant:

inline Token Lexer::nextToken(bool isValueToken)
{
    char c;
    while (current(&c)) {
        if (c == ' ' || c == '\t' || c == '\r') {
            next();
            continue;
        }

        if (c == '#') {
            skipUntilNewLine();
            continue;
        }

        switch (c) {
        case '\n':
            next();
            return Token(TokenType::END_OF_LINE);
        case '=':
            next();
            return Token(TokenType::EQUAL);
        case '{':
            next();
            return Token(TokenType::LBRACE);
        case '}':
            next();
            return Token(TokenType::RBRACE);
        case '[':
            next();
            return Token(TokenType::LBRACKET);
        case ']':
            next();
            return Token(TokenType::RBRACKET);
        case ',':
            next();
            return Token(TokenType::COMMA);
        case '.':
            next();
            return Token(TokenType::DOT);
        case '\"':
            return nextStringDoubleQuote();
        case '\'':
            return nextStringSingleQuote();
        default:
            if (isValueToken) {
                return nextValue();
            } else {
                return nextKey();
            }
        }
    }

    return Token(TokenType::END_OF_FILE);
}